

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
SymmetricAlgorithm::decryptInit
          (SymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *param_4,bool padding,
          size_t counterBits,ByteString *param_7,size_t tagBytes)

{
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  size_t in_R9;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  if ((in_RSI == 0) || (*(int *)(in_RDI + 0x28) != 0)) {
    local_1 = false;
  }
  else {
    *(long *)(in_RDI + 8) = in_RSI;
    *(undefined4 *)(in_RDI + 0x10) = in_EDX;
    *(byte *)(in_RDI + 0x14) = in_R8B & 1;
    *(size_t *)(in_RDI + 0x18) = in_R9;
    *(size_t *)(in_RDI + 0x20) = counterBits;
    *(undefined4 *)(in_RDI + 0x28) = 2;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    ByteString::wipe((ByteString *)(CONCAT17(in_R8B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
                     in_R9);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SymmetricAlgorithm::decryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& /*IV = ByteString() */, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& /*aad = ByteString()*/, size_t tagBytes /* = 0 */)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentKey = key;
	currentCipherMode = mode;
	currentPaddingMode = padding;
	currentCounterBits = counterBits;
	currentTagBytes = tagBytes;
	currentOperation = DECRYPT;
	currentBufferSize = 0;
	currentAEADBuffer.wipe();

	return true;
}